

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O1

ulint __thiscall
bwtil::WaveletTree::recursiveRank(WaveletTree *this,uchar c,ulint i,ulint node,uint level)

{
  pointer psVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  
  uVar5 = ~level;
  psVar1 = (this->nodes).
           super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    uVar2 = psVar1[node].n;
    if (uVar2 == 0) {
      return 0;
    }
    uVar9 = i >> 6;
    bVar7 = (byte)i & 0x3f;
    uVar6 = 1 << (uVar5 + this->log_sigma & 0x1f) & (uint)c;
    if (uVar6 == 0) {
      if (uVar2 == i) {
        iVar8 = (int)psVar1[node].global_rank1;
      }
      else {
        if ((i & 0x3f) == 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = (int)POPCOUNT(*(ulong *)(*(long *)&psVar1[node].bitvector.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + uVar9 * 8) >>
                                ((ulong)(byte)-bVar7 & 0x3f));
        }
        iVar8 = iVar8 + (int)*(undefined8 *)
                              (*(long *)&psVar1[node].rank_ptrs_1.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data + (i >> 0xc) * 8) +
                (uint)*(ushort *)
                       (*(long *)&psVar1[node].rank_ptrs_2.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data + uVar9 * 2);
      }
      uVar4 = (int)i - iVar8;
    }
    else if (uVar2 == i) {
      uVar4 = (uint)psVar1[node].global_rank1;
    }
    else {
      if ((i & 0x3f) == 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = (int)POPCOUNT(*(ulong *)(*(long *)&psVar1[node].bitvector.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + uVar9 * 8) >>
                              ((ulong)(byte)-bVar7 & 0x3f));
      }
      uVar4 = iVar8 + (int)*(undefined8 *)
                            (*(long *)&psVar1[node].rank_ptrs_1.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data + (i >> 0xc) * 8) +
              (uint)*(ushort *)
                     (*(long *)&psVar1[node].rank_ptrs_2.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data + uVar9 * 2);
    }
    i = (ulint)uVar4;
    if (level == this->log_sigma - 1) break;
    lVar3 = node * 2;
    node = node * 2 + 2;
    if (uVar6 == 0) {
      node = lVar3 + 1;
    }
    level = level + 1;
    uVar5 = uVar5 - 1;
  }
  return i;
}

Assistant:

ulint recursiveRank(uchar c, ulint i, ulint node, uint level){//number of characters 'c' before position i excluded

		if(nodes[node].length()==0)//empty node
			return 0;

		uint bit = bitInChar(c,level);
		uint rank;

		if(bit==0)
			rank = nodes[node].rank0(i);
		else
			rank = nodes[node].rank1(i);

		if(level==log_sigma-1)//leaf
			return rank;

		//not a leaf: proceed recursively

		return recursiveRank(c, rank, (bit==0?child0(node):child1(node)), level+1);

	}